

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

FunctionValue *
GetFunctionForType(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ExprBase *value,TypeFunction *type)

{
  ModuleData *pMVar1;
  TypeFunction *pTVar2;
  undefined1 auVar3 [16];
  ArrayView<ArgumentData> arguments_00;
  bool bVar4;
  int iVar5;
  TypeBase *pTVar6;
  TypeHandle *pTVar7;
  TypeHandle *pTVar8;
  TypeHandle *pTVar9;
  SynBase **ppSVar10;
  long lVar11;
  int iVar12;
  FunctionData *pFVar13;
  SynBase *pSVar14;
  ExpressionContext *this;
  ulong uVar15;
  IntrusiveList<TypeHandle> arguments_01;
  FunctionValue bestGenericMatch;
  IntrusiveList<TypeHandle> arguments;
  FunctionValue bestMatch;
  SmallArray<FunctionValue,_32U> functions;
  IntrusiveList<MatchData> aliases;
  TypeFunction *local_9f8;
  TypeFunction *local_9e0;
  SynBase *local_9d8;
  char *pcStack_9d0;
  undefined8 local_9c8;
  SynBase *local_9c0;
  undefined1 local_9b8 [40];
  char *pcStack_990;
  ModuleData *local_988;
  TypeBase *local_978;
  ModuleData *local_970;
  uint uStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [8];
  ModuleData *local_958;
  ModuleData local_950 [10];
  undefined8 uStack_658;
  ModuleData *local_650;
  undefined1 local_648 [24];
  undefined8 auStack_630 [191];
  ModuleData *local_38;
  undefined4 extraout_var;
  
  pMVar1 = (ModuleData *)ctx->allocator;
  memset(local_950,0,0x300);
  local_958 = (ModuleData *)0x2000000000;
  this = ctx;
  local_960 = (undefined1  [8])local_950;
  local_650 = pMVar1;
  GetNodeFunctions(ctx,source,value,(SmallArray<FunctionValue,_32U> *)(local_9b8 + 0x58));
  if ((int)local_958 != 0) {
    local_9b8._32_8_ = (SynBase *)0x0;
    pcStack_990 = (char *)0x0;
    uVar15 = 0;
    local_988 = (ModuleData *)0x0;
    local_9c8 = 0;
    local_9d8 = (SynBase *)0x0;
    pcStack_9d0 = (char *)0x0;
    local_9f8 = (TypeFunction *)0x0;
    local_9e0 = (TypeFunction *)0x0;
    local_9c0 = source;
    do {
      pTVar9 = (type->arguments).head;
      iVar5 = 0;
      if (pTVar9 != (TypeHandle *)0x0) {
        iVar5 = 0;
        pTVar8 = pTVar9;
        do {
          iVar5 = iVar5 + 1;
          pTVar8 = pTVar8->next;
        } while (pTVar8 != (TypeHandle *)0x0);
      }
      pTVar2 = *(TypeFunction **)(*(long *)((long)((long)local_960 + 8) + uVar15 * 0x18) + 0x28);
      iVar12 = 0;
      pTVar8 = (pTVar2->arguments).head;
      for (pTVar7 = pTVar8; pTVar7 != (TypeHandle *)0x0; pTVar7 = pTVar7->next) {
        iVar12 = iVar12 + 1;
      }
      if (iVar5 == iVar12) {
        if ((type->super_TypeBase).isGeneric == true) {
          local_648._0_8_ = (ModuleData *)0x0;
          local_648._8_8_ = (ModuleData *)0x0;
          this = ctx;
          local_978 = MatchGenericType(ctx,source,type->returnType,pTVar2->returnType,
                                       (IntrusiveList<MatchData> *)local_648,true);
          local_9b8._0_8_ = (SynBase *)0x0;
          local_9b8._8_8_ = (FunctionData *)0x0;
          pTVar9 = (type->arguments).head;
          if (pTVar9 != (TypeHandle *)0x0) {
            for (pTVar8 = (pTVar2->arguments).head; pTVar8 != (TypeHandle *)0x0;
                pTVar8 = pTVar8->next) {
              this = ctx;
              pTVar6 = MatchGenericType(ctx,source,pTVar9->type,pTVar8->type,
                                        (IntrusiveList<MatchData> *)local_648,true);
              if ((pTVar6 != (TypeBase *)0x0) && (pTVar6->isGeneric == false)) {
                iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                pTVar7 = (TypeHandle *)CONCAT44(extraout_var,iVar5);
                pTVar7->type = pTVar6;
                pTVar7->next = (TypeHandle *)0x0;
                pTVar7->listed = false;
                this = (ExpressionContext *)local_9b8;
                IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)this,pTVar7);
              }
              pTVar9 = pTVar9->next;
              if (pTVar9 == (TypeHandle *)0x0) break;
            }
          }
          if (local_978 != (TypeBase *)0x0) {
            iVar5 = 0;
            this = (ExpressionContext *)0x0;
            if ((SynBase *)local_9b8._0_8_ != (SynBase *)0x0) {
              this = (ExpressionContext *)0x0;
              pSVar14 = (SynBase *)local_9b8._0_8_;
              do {
                this = (ExpressionContext *)(ulong)((int)this + 1);
                pSVar14 = *(SynBase **)&pSVar14->typeID;
              } while (pSVar14 != (SynBase *)0x0);
            }
            pTVar9 = (type->arguments).head;
            if (pTVar9 != (TypeHandle *)0x0) {
              iVar5 = 0;
              do {
                iVar5 = iVar5 + 1;
                pTVar9 = pTVar9->next;
              } while (pTVar9 != (TypeHandle *)0x0);
            }
            if ((int)this == iVar5) {
              if (pcStack_9d0 != (char *)0x0) goto LAB_0015d4f0;
              if (((ulong)local_958 & 0xffffffff) <= uVar15) {
LAB_0015d54d:
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<FunctionValue, 32>::operator[](unsigned int) [T = FunctionValue, N = 32]"
                             );
              }
              local_9d8 = ((SynBase **)local_960)[uVar15 * 3];
              pcStack_9d0 = ((InplaceStr *)((SynBase **)local_960 + uVar15 * 3 + 1))->begin;
              local_9c8 = *(undefined8 *)((long)((long)local_960 + 8) + uVar15 * 0x18 + 8);
              arguments_01.tail = (TypeHandle *)local_9b8._8_8_;
              arguments_01.head = (TypeHandle *)local_9b8._0_8_;
              this = ctx;
              local_9e0 = ExpressionContext::GetFunctionType(ctx,source,local_978,arguments_01);
            }
          }
        }
        else if ((pTVar2->super_TypeBase).isGeneric == true) {
          local_648._0_8_ = (ModuleData *)0x0;
          local_648._8_8_ = (ModuleData *)0x0;
          iVar5 = 0;
          if (pTVar9 != (TypeHandle *)0x0 && pTVar8 != (TypeHandle *)0x0) {
            iVar5 = 0;
            do {
              this = ctx;
              pTVar6 = MatchGenericType(ctx,local_9c0,pTVar8->type,pTVar9->type,
                                        (IntrusiveList<MatchData> *)local_648,true);
              if (pTVar6 != (TypeBase *)0x0) {
                iVar5 = iVar5 + (pTVar6->isGeneric ^ 1);
              }
              pTVar8 = pTVar8->next;
            } while ((pTVar8 != (TypeHandle *)0x0) &&
                    (pTVar9 = pTVar9->next, pTVar9 != (TypeHandle *)0x0));
          }
          if ((pTVar2->returnType == ctx->typeAuto) || (pTVar2->returnType == type->returnType)) {
            iVar5 = iVar5 + 1;
          }
          iVar12 = 1;
          for (pTVar9 = (type->arguments).head; pTVar9 != (TypeHandle *)0x0; pTVar9 = pTVar9->next)
          {
            iVar12 = iVar12 + 1;
          }
          source = local_9c0;
          if (iVar5 == iVar12) {
            if (pcStack_9d0 != (char *)0x0) goto LAB_0015d4f0;
            if (((ulong)local_958 & 0xffffffff) <= uVar15) goto LAB_0015d54d;
            local_9d8 = ((SynBase **)local_960)[uVar15 * 3];
            pcStack_9d0 = ((InplaceStr *)((SynBase **)local_960 + uVar15 * 3 + 1))->begin;
            local_9c8 = *(undefined8 *)((long)((long)local_960 + 8) + uVar15 * 0x18 + 8);
            local_9e0 = type;
          }
        }
        else if (pTVar2 == type) {
          if (pcStack_990 != (char *)0x0) goto LAB_0015d4f0;
          ppSVar10 = (SynBase **)local_960 + uVar15 * 3;
          local_988 = (ModuleData *)ppSVar10[2];
          local_9b8._32_8_ = *ppSVar10;
          pcStack_990 = ((InplaceStr *)(ppSVar10 + 1))->begin;
          local_9f8 = type;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < ((ulong)local_958 & 0xffffffff));
    ppSVar10 = &local_9d8;
    if (pcStack_990 != (char *)0x0) {
      ppSVar10 = (SynBase **)(local_9b8 + 0x20);
    }
    pFVar13 = (FunctionData *)ppSVar10[1];
    __return_storage_ptr__->source = *ppSVar10;
    __return_storage_ptr__->function = pFVar13;
    __return_storage_ptr__->context = (ExprBase *)ppSVar10[2];
    if (pcStack_990 == (char *)0x0) {
      local_9f8 = local_9e0;
    }
    pFVar13 = __return_storage_ptr__->function;
    if (pFVar13 != (FunctionData *)0x0) {
      pMVar1 = (ModuleData *)ctx->allocator;
      lVar11 = 0x20;
      do {
        *(undefined8 *)((long)&uStack_658 + lVar11) = 0;
        *(undefined1 *)((long)&local_650 + lVar11) = 0;
        *(undefined8 *)(local_648 + lVar11) = 0;
        *(undefined8 *)(local_648 + lVar11 + 8) = 0;
        *(undefined8 *)(local_648 + lVar11 + 0x10) = 0;
        *(undefined8 *)((long)auStack_630 + lVar11) = 0;
        lVar11 = lVar11 + 0x30;
      } while (lVar11 != 0x620);
      local_648._0_8_ = local_648 + 0x10;
      local_648._8_8_ = (ModuleData *)0x2000000000;
      pTVar9 = (local_9f8->arguments).head;
      local_38 = pMVar1;
      if (pTVar9 != (TypeHandle *)0x0) {
        do {
          pTVar6 = pTVar9->type;
          if (local_648._8_4_ == local_648._12_4_) {
            this = (ExpressionContext *)local_648;
            SmallArray<ArgumentData,_32U>::grow
                      ((SmallArray<ArgumentData,_32U> *)local_648,local_648._8_4_);
          }
          if ((ModuleData *)local_648._0_8_ == (ModuleData *)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]"
                         );
          }
          uVar15 = local_648._8_8_ & 0xffffffff;
          local_648._8_4_ = local_648._8_4_ + 1;
          ((SynBase **)local_648._0_8_)[uVar15 * 6] = source;
          *(bool *)&((InplaceStr *)(local_648._0_8_ + 8))[uVar15 * 3].begin = false;
          ((InplaceStr *)(local_648._0_8_ + 8))[uVar15 * 3].end = (char *)0x0;
          ((TypeBase **)(local_648._0_8_ + 0x18))[uVar15 * 6] = pTVar6;
          ((ByteCode **)(local_648._0_8_ + 0x20))[uVar15 * 6] = (ByteCode *)0x0;
          ((ByteCode **)(local_648._0_8_ + 0x20) + uVar15 * 6)[1] = (ByteCode *)0x0;
          pTVar9 = pTVar9->next;
        } while (pTVar9 != (TypeHandle *)0x0);
      }
      bVar4 = ExpressionContext::IsGenericFunction(this,pFVar13);
      if (bVar4) {
        local_970 = (ModuleData *)local_648._0_8_;
        uStack_968 = local_648._8_4_;
        arguments_00._12_4_ = uStack_964;
        arguments_00.count = local_648._8_4_;
        arguments_00.data = (ArgumentData *)local_648._0_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = type;
        CreateGenericFunctionInstance
                  ((FunctionValue *)local_9b8,ctx,source,*__return_storage_ptr__,
                   (IntrusiveList<TypeHandle>)(auVar3 << 0x40),arguments_00,false);
        __return_storage_ptr__->context = (ExprBase *)local_9b8._16_8_;
        __return_storage_ptr__->source = (SynBase *)local_9b8._0_8_;
        __return_storage_ptr__->function = (FunctionData *)local_9b8._8_8_;
        pFVar13 = __return_storage_ptr__->function;
      }
      if (pFVar13 != (FunctionData *)0x0) {
        if (local_9f8->returnType == ctx->typeAuto) {
          local_9f8 = ExpressionContext::GetFunctionType
                                (ctx,source,pFVar13->type->returnType,local_9f8->arguments);
        }
        if (pFVar13->type == local_9f8) {
          SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_648);
          goto LAB_0015d4fd;
        }
      }
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_648);
    }
  }
LAB_0015d4f0:
  __return_storage_ptr__->source = (SynBase *)0x0;
  __return_storage_ptr__->function = (FunctionData *)0x0;
  __return_storage_ptr__->context = (ExprBase *)0x0;
LAB_0015d4fd:
  SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)(local_9b8 + 0x58));
  return __return_storage_ptr__;
}

Assistant:

FunctionValue GetFunctionForType(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeFunction *type)
{
	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);

	GetNodeFunctions(ctx, source, value, functions);

	if(!functions.empty())
	{
		FunctionValue bestMatch;
		TypeFunction *bestMatchTarget = NULL;

		FunctionValue bestGenericMatch;
		TypeFunction *bestGenericMatchTarget = NULL;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			TypeFunction *functionType = functions[i].function->type;

			if(type->arguments.size() != functionType->arguments.size())
				continue;

			if(type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				TypeBase *returnType = MatchGenericType(ctx, source, type->returnType, functionType->returnType, aliases, true);
				IntrusiveList<TypeHandle> arguments;

				for(TypeHandle *lhs = type->arguments.head, *rhs = functionType->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(match));
				}

				if(returnType && arguments.size() == type->arguments.size())
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = ctx.GetFunctionType(source, returnType, arguments);
				}
			}
			else if(functionType->isGeneric)
			{
				unsigned matches = 0;

				IntrusiveList<MatchData> aliases;

				for(TypeHandle *lhs = functionType->arguments.head, *rhs = type->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						matches++;
				}

				if(functionType->returnType == ctx.typeAuto || functionType->returnType == type->returnType)
					matches++;

				if(matches == type->arguments.size() + 1)
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = type;
				}
			}
			else if(functionType == type)
			{
				if(bestMatch)
					return FunctionValue();

				bestMatch = functions[i];
				bestMatchTarget = type;
			}
		}

		FunctionValue bestOverload = bestMatch ? bestMatch : bestGenericMatch;
		TypeFunction *bestTarget = bestMatch ? bestMatchTarget : bestGenericMatchTarget;

		if(bestOverload)
		{
			SmallArray<ArgumentData, 32> arguments(ctx.allocator);

			for(TypeHandle *curr = bestTarget->arguments.head; curr; curr = curr->next)
				arguments.push_back(ArgumentData(source, false, NULL, curr->type, NULL));

			FunctionData *function = bestOverload.function;

			if(ctx.IsGenericFunction(function))
				bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, IntrusiveList<TypeHandle>(), arguments, false);

			if(bestOverload)
			{
				if(bestTarget->returnType == ctx.typeAuto)
					bestTarget = ctx.GetFunctionType(source, bestOverload.function->type->returnType, bestTarget->arguments);

				if(bestOverload.function->type == bestTarget)
					return bestOverload;
			}
		}
	}

	return FunctionValue();
}